

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_ruleparser.h
# Opt level: O2

void __thiscall BamTools::RuleParser::parse(RuleParser *this)

{
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  stack<BamTools::RuleToken,_std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>_>
  *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  _Elt_pointer pRVar4;
  RuleToken token;
  undefined1 local_58 [8];
  value_type local_50;
  
  this_00 = &this->m_ruleQueue;
  while ((this->m_ruleQueue).c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         (this->m_ruleQueue).c.
         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this_00->c);
  }
  if ((this->m_ruleString)._M_string_length != 0) {
    this->m_current = this->m_begin;
    local_50._M_dataplus._M_p = local_58 + 0x18;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    this_01 = &this->m_operatorStack;
    while (bVar1 = readToken(this,(RuleToken *)local_58), bVar1 && local_50._M_string_length != 0) {
      if (local_58._0_4_ == OPERAND) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_00->c,(value_type *)(local_58 + 8));
      }
      else if ((uint)local_58._0_4_ < LEFT_PARENTHESIS) {
        while (pRVar4 = (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur,
              pRVar4 != (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if (pRVar4 == (this->m_operatorStack).c.
                        super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pRVar4 = (this->m_operatorStack).c.
                     super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          if (local_58._0_4_ - RIGHT_PARENTHESIS < 0xfffffffe) {
            iVar2 = priority((RuleToken *)local_58);
            iVar3 = priority(pRVar4 + -1);
            if (iVar3 < iVar2) goto LAB_0016f73c;
          }
          else {
LAB_0016f73c:
            if (1 < local_58._0_4_ - NOT_OPERATOR) break;
            iVar2 = priority((RuleToken *)local_58);
            iVar3 = priority(pRVar4 + -1);
            if (iVar3 <= iVar2) break;
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_00->c,&pRVar4[-1].Value);
          std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back
                    (&this_01->c);
        }
LAB_0016f7fa:
        std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::push_back
                  (&this_01->c,(value_type *)local_58);
      }
      else {
        if (local_58._0_4_ == LEFT_PARENTHESIS) goto LAB_0016f7fa;
        if (local_58._0_4_ == RIGHT_PARENTHESIS) {
          bVar1 = false;
          while ((pRVar4 = (this->m_operatorStack).c.
                           super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur,
                 pRVar4 != (this->m_operatorStack).c.
                           super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur && (!bVar1))) {
            if (pRVar4 == (this->m_operatorStack).c.
                          super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pRVar4 = (this->m_operatorStack).c.
                       super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                       _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
            }
            bVar1 = pRVar4[-1].Type == LEFT_PARENTHESIS;
            if (!bVar1) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this_00->c,&pRVar4[-1].Value);
            }
            std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back
                      (&this_01->c);
          }
        }
      }
    }
    while (pRVar4 = (this->m_operatorStack).c.
                    super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur,
          pRVar4 != (this->m_operatorStack).c.
                    super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pRVar4 == (this->m_operatorStack).c.
                    super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pRVar4 = (this->m_operatorStack).c.
                 super__Deque_base<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this_00->c,&pRVar4[-1].Value);
      std::deque<BamTools::RuleToken,_std::allocator<BamTools::RuleToken>_>::pop_back(&this_01->c);
    }
    std::__cxx11::string::~string((string *)(local_58 + 8));
  }
  return;
}

Assistant:

inline void RuleParser::parse()
{

    // clear out any prior data
    while (!m_ruleQueue.empty())
        m_ruleQueue.pop();

    // skip if no rule to parse
    if (m_ruleString.empty()) return;

    // start at beginning of ruleString
    m_current = m_begin;

    // iterate through tokens in rule string
    RuleToken token;
    while (readToken(token)) {

        if (token.Value.empty()) break;

        // if token is an operand
        if (isOperand(token)) m_ruleQueue.push(token.Value);

        // if token is an operator
        else if (isOperator(token)) {

            // pop any operators at top of stack with higher priority
            while (!m_operatorStack.empty()) {
                const RuleToken& opToken = m_operatorStack.top();
                if ((isLeftAssociative(token) && (priority(token) <= priority(opToken))) ||
                    (isRightAssociative(token) && (priority(token) < priority(opToken)))) {
                    m_ruleQueue.push(opToken.Value);
                    m_operatorStack.pop();
                } else
                    break;
            }

            // push current operator token onto stack
            m_operatorStack.push(token);
        }

        // if token is left parenthesis
        else if (isLeftParenthesis(token))
            m_operatorStack.push(token);

        // if token is right parenthesis
        else if (isRightParenthesis(token)) {

            bool foundLeftParenthesis = false;

            // push operators into rule queue until left parenthesis found
            while (!m_operatorStack.empty() && !foundLeftParenthesis) {
                const RuleToken& opToken = m_operatorStack.top();
                if (!isLeftParenthesis(opToken))
                    m_ruleQueue.push(opToken.Value);
                else
                    foundLeftParenthesis = true;
                m_operatorStack.pop();
            }

            // no left parenthesis found, error
            BAMTOOLS_ASSERT_MESSAGE(foundLeftParenthesis,
                                    "ERROR: Mismatched parenthesis in rule string.1");
        }

        // error: unknown operand
        else
            BAMTOOLS_ASSERT_UNREACHABLE;
    }

    // while there are still operators on stack
    while (!m_operatorStack.empty()) {
        const RuleToken& token = m_operatorStack.top();
        BAMTOOLS_ASSERT_MESSAGE((!isLeftParenthesis(token) && !isRightParenthesis(token)),
                                "ERROR: Mismatched parenthesis in rule string.2");
        m_ruleQueue.push(token.Value);
        m_operatorStack.pop();
    }
}